

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O2

void __thiscall CPT::SetRandom(CPT *this)

{
  size_type sVar1;
  size_type sVar2;
  int iVar3;
  double *pdVar4;
  size_type sVar5;
  size_t x;
  size_type sVar6;
  long lVar7;
  size_t y;
  size_type sVar8;
  bool bVar9;
  double dVar10;
  
  sVar1 = (this->_m_probTable).size1_;
  sVar2 = (this->_m_probTable).size2_;
  lVar7 = 0;
  for (sVar8 = 0; sVar8 != sVar2; sVar8 = sVar8 + 1) {
    dVar10 = 0.0;
    for (sVar6 = 0; sVar1 != sVar6; sVar6 = sVar6 + 1) {
      iVar3 = rand();
      dVar10 = dVar10 + (double)iVar3;
      (this->_m_probTable).data_.data_[(this->_m_probTable).size2_ * sVar6 + sVar8] = (double)iVar3;
    }
    sVar6 = (this->_m_probTable).size2_;
    pdVar4 = (double *)((long)(this->_m_probTable).data_.data_ + lVar7);
    sVar5 = sVar1;
    while (bVar9 = sVar5 != 0, sVar5 = sVar5 - 1, bVar9) {
      *pdVar4 = *pdVar4 / dVar10;
      pdVar4 = pdVar4 + sVar6;
    }
    lVar7 = lVar7 + 8;
  }
  return;
}

Assistant:

void CPT::SetRandom()
{
    //cout << "Starting CPT::SanityCheck()"<<endl;
    size_t X = _m_probTable.size1();
    size_t Y = _m_probTable.size2();
    for(size_t y=0; y < Y; y++) 
    {
        double psum = 0.0;
        for(size_t x=0; x < X; x++) 
        {
            double p = rand();
            psum += p;
            _m_probTable(x,y) = p;
        }
        //normalize:
        for(size_t x=0; x < X; x++) 
            _m_probTable(x,y) /= psum;
    }

}